

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  DIdxSet *this_00;
  uint *puVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  int *piVar6;
  undefined8 uVar7;
  type_conflict5 tVar8;
  DataKey DVar9;
  ulong uVar10;
  ulong uVar11;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar12;
  int local_35c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_300;
  ulong local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  pointer local_2e8;
  int local_2dc;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  devexpr local_178 [8];
  uint auStack_170 [2];
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148 [2];
  undefined8 uStack_140;
  int local_138;
  undefined1 local_134;
  fpclass_type local_130;
  int32_t iStack_12c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  devexpr local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  pSVar4 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar5 = (pSVar4->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2e8 = (pSVar4->weights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2f0 = best;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_268,-1,(type *)0x0);
  local_358.m_backend.fpclass = cpp_dec_float_finite;
  local_358.m_backend.prec_elem = 0x10;
  local_358.m_backend.data._M_elems[0] = 0;
  local_358.m_backend.data._M_elems[1] = 0;
  local_358.m_backend.data._M_elems[2] = 0;
  local_358.m_backend.data._M_elems[3] = 0;
  local_358.m_backend.data._M_elems[4] = 0;
  local_358.m_backend.data._M_elems[5] = 0;
  local_358.m_backend.data._M_elems[6] = 0;
  local_358.m_backend.data._M_elems[7] = 0;
  local_358.m_backend.data._M_elems[0xc] = 0;
  local_358.m_backend.data._M_elems[0xd] = 0;
  local_358.m_backend.data._M_elems._56_5_ = 0;
  local_358.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_358.m_backend.exp = 0;
  local_358.m_backend.neg = false;
  local_358.m_backend.data._M_elems[8] = 0;
  local_358.m_backend.data._M_elems[9] = 0;
  local_358.m_backend.data._M_elems[10] = 0;
  local_358.m_backend.data._M_elems[0xb] = 0;
  uVar11 = (ulong)(uint)(this->bestPricesCo).super_IdxSet.num;
  local_35c = -1;
  local_300 = this;
LAB_00366aa6:
  uVar10 = uVar11 & 0xffffffff;
  while( true ) {
    uVar11 = uVar11 - 1;
    if ((int)uVar10 < 1) {
      this_00 = &local_300->bestPricesCo;
      uVar11 = (ulong)(uint)(((local_300->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->updateViolsCo).super_IdxSet.num;
      pSVar12 = local_300;
      goto LAB_00366e90;
    }
    iVar2 = (local_300->bestPricesCo).super_IdxSet.idx[uVar11];
    local_2f8 = CONCAT44(local_2f8._4_4_,iVar2);
    local_358.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
    local_358.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
    local_358.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_358.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
    local_358.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_358.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x30);
    local_358.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar7 = *(undefined8 *)(puVar1 + 2);
    local_358.m_backend.data._M_elems._56_5_ = SUB85(uVar7,0);
    local_358.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_358.m_backend.exp = pnVar5[iVar2].m_backend.exp;
    local_358.m_backend.neg = pnVar5[iVar2].m_backend.neg;
    local_358.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
    local_358.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10)
    ;
    result.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
    result.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    pSVar12 = local_300;
    tVar8 = boost::multiprecision::operator<(&local_358,&result);
    if (tVar8) break;
    piVar6 = (local_300->bestPricesCo).super_IdxSet.idx;
    iVar3 = (local_300->bestPricesCo).super_IdxSet.num;
    (local_300->bestPricesCo).super_IdxSet.num = iVar3 + -1;
    piVar6[uVar11] = piVar6[(long)iVar3 + -1];
    (((local_300->
      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thesolver)->isInfeasibleCo).data[iVar2] = 0;
    uVar10 = (ulong)((int)uVar10 - 1);
  }
  uStack_50 = CONCAT35(local_358.m_backend.data._M_elems[0xf]._1_3_,
                       local_358.m_backend.data._M_elems._56_5_);
  local_88 = (devexpr  [8])local_358.m_backend.data._M_elems._0_8_;
  auStack_80[0] = local_358.m_backend.data._M_elems[2];
  auStack_80[1] = local_358.m_backend.data._M_elems[3];
  local_78[0] = local_358.m_backend.data._M_elems[4];
  local_78[1] = local_358.m_backend.data._M_elems[5];
  auStack_70[0] = local_358.m_backend.data._M_elems[6];
  auStack_70[1] = local_358.m_backend.data._M_elems[7];
  local_68[0] = local_358.m_backend.data._M_elems[8];
  local_68[1] = local_358.m_backend.data._M_elems[9];
  auStack_60[0] = local_358.m_backend.data._M_elems[10];
  auStack_60[1] = local_358.m_backend.data._M_elems[0xb];
  local_58[0] = local_358.m_backend.data._M_elems[0xc];
  local_58[1] = local_358.m_backend.data._M_elems[0xd];
  local_48 = local_358.m_backend.exp;
  local_44 = local_358.m_backend.neg;
  local_40 = local_358.m_backend.fpclass;
  iStack_3c = local_358.m_backend.prec_elem;
  local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_2e8[iVar2].m_backend.data;
  local_d8.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((long)&local_2e8[iVar2].m_backend.data + 8);
  puVar1 = (uint *)((long)&local_2e8[iVar2].m_backend.data + 0x10);
  local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&local_2e8[iVar2].m_backend.data + 0x20);
  local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&local_2e8[iVar2].m_backend.data + 0x30);
  local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
  local_d8.m_backend.exp = local_2e8[iVar2].m_backend.exp;
  local_d8.m_backend.neg = local_2e8[iVar2].m_backend.neg;
  local_d8.m_backend.fpclass = local_2e8[iVar2].m_backend.fpclass;
  local_d8.m_backend.prec_elem = local_2e8[iVar2].m_backend.prec_elem;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4)
  ;
  local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6)
  ;
  local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8)
  ;
  local_128.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
  local_128.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
  local_128.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
  local_128.m_backend.exp = (feastol->m_backend).exp;
  local_128.m_backend.neg = (feastol->m_backend).neg;
  local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
  local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
  devexpr::
  computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&result,local_88,&local_d8,&local_128,
             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)pSVar12);
  local_358.m_backend.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
  local_358.m_backend.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
  local_358.m_backend.data._M_elems._56_5_ = result.m_backend.data._M_elems._56_5_;
  local_358.m_backend.data._M_elems[0xf]._1_3_ = result.m_backend.data._M_elems[0xf]._1_3_;
  local_358.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
  local_358.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
  local_358.m_backend.data._M_elems[10] = result.m_backend.data._M_elems[10];
  local_358.m_backend.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
  local_358.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_358.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_358.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
  local_358.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
  local_358.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_358.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_358.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_358.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_358.m_backend.exp = result.m_backend.exp;
  local_358.m_backend.neg = result.m_backend.neg;
  local_358.m_backend.fpclass = result.m_backend.fpclass;
  local_358.m_backend.prec_elem = result.m_backend.prec_elem;
  tVar8 = boost::multiprecision::operator>(&local_358,local_2f0);
  if (tVar8) {
    *(undefined8 *)((local_2f0->m_backend).data._M_elems + 0xc) =
         local_358.m_backend.data._M_elems._48_8_;
    *(ulong *)((local_2f0->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_358.m_backend.data._M_elems[0xf]._1_3_,
                  local_358.m_backend.data._M_elems._56_5_);
    *(undefined8 *)((local_2f0->m_backend).data._M_elems + 8) =
         local_358.m_backend.data._M_elems._32_8_;
    *(undefined8 *)((local_2f0->m_backend).data._M_elems + 10) =
         local_358.m_backend.data._M_elems._40_8_;
    *(undefined8 *)((local_2f0->m_backend).data._M_elems + 4) =
         local_358.m_backend.data._M_elems._16_8_;
    *(undefined8 *)((local_2f0->m_backend).data._M_elems + 6) =
         local_358.m_backend.data._M_elems._24_8_;
    *(undefined8 *)(local_2f0->m_backend).data._M_elems = local_358.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((local_2f0->m_backend).data._M_elems + 2) =
         local_358.m_backend.data._M_elems._8_8_;
    (local_2f0->m_backend).exp = local_358.m_backend.exp;
    (local_2f0->m_backend).neg = local_358.m_backend.neg;
    (local_2f0->m_backend).fpclass = local_358.m_backend.fpclass;
    (local_2f0->m_backend).prec_elem = local_358.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&(this->last).m_backend,&local_2e8[iVar2].m_backend);
    local_35c = (int)local_2f8;
  }
  tVar8 = boost::multiprecision::operator<
                    (&local_358,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_268);
  if (!tVar8) goto LAB_00366de9;
  goto LAB_00366e0e;
LAB_00366e90:
  uVar10 = uVar11 & 0xffffffff;
  do {
    uVar11 = uVar11 - 1;
    if ((int)uVar10 < 1) {
      if (local_35c < 0) {
        DVar9.info = 0;
        DVar9.idx = -1;
      }
      else {
        DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::id((pSVar12->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver,local_35c);
      }
      return (SPxId)DVar9;
    }
    pSVar4 = (pSVar12->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    iVar2 = (pSVar4->updateViolsCo).super_IdxSet.idx[uVar11];
    if ((pSVar4->isInfeasibleCo).data[iVar2] == 1) {
      local_358.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
      local_358.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
      local_358.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_358.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
      local_358.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_358.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x30);
      local_358.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      local_358.m_backend.data._M_elems._56_5_ = SUB85(uVar7,0);
      local_358.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_358.m_backend.exp = pnVar5[iVar2].m_backend.exp;
      local_358.m_backend.neg = pnVar5[iVar2].m_backend.neg;
      local_358.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
      local_358.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
      result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2)
      ;
      result.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      result.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      result.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      result.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      result.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      result.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      result.m_backend.exp = (feastol->m_backend).exp;
      result.m_backend.neg = (feastol->m_backend).neg;
      result.m_backend.fpclass = (feastol->m_backend).fpclass;
      result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0
         ) {
        result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
      }
      local_2f8 = uVar11;
      local_2dc = iVar2;
      tVar8 = boost::multiprecision::operator<(&local_358,&result);
      if (tVar8) {
        uStack_140 = CONCAT35(local_358.m_backend.data._M_elems[0xf]._1_3_,
                              local_358.m_backend.data._M_elems._56_5_);
        local_178 = (devexpr  [8])local_358.m_backend.data._M_elems._0_8_;
        auStack_170[0] = local_358.m_backend.data._M_elems[2];
        auStack_170[1] = local_358.m_backend.data._M_elems[3];
        local_168[0] = local_358.m_backend.data._M_elems[4];
        local_168[1] = local_358.m_backend.data._M_elems[5];
        auStack_160[0] = local_358.m_backend.data._M_elems[6];
        auStack_160[1] = local_358.m_backend.data._M_elems[7];
        local_158[0] = local_358.m_backend.data._M_elems[8];
        local_158[1] = local_358.m_backend.data._M_elems[9];
        auStack_150[0] = local_358.m_backend.data._M_elems[10];
        auStack_150[1] = local_358.m_backend.data._M_elems[0xb];
        local_148[0] = local_358.m_backend.data._M_elems[0xc];
        local_148[1] = local_358.m_backend.data._M_elems[0xd];
        local_138 = local_358.m_backend.exp;
        local_134 = local_358.m_backend.neg;
        local_130 = local_358.m_backend.fpclass;
        iStack_12c = local_358.m_backend.prec_elem;
        local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_2e8[iVar2].m_backend.data;
        local_1c8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_2e8[iVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_2e8[iVar2].m_backend.data + 0x10);
        local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_1c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_2e8[iVar2].m_backend.data + 0x20);
        local_1c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_1c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_2e8[iVar2].m_backend.data + 0x30);
        local_1c8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_1c8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_1c8.m_backend.exp = local_2e8[iVar2].m_backend.exp;
        local_1c8.m_backend.neg = local_2e8[iVar2].m_backend.neg;
        local_1c8.m_backend.fpclass = local_2e8[iVar2].m_backend.fpclass;
        local_1c8.m_backend.prec_elem = local_2e8[iVar2].m_backend.prec_elem;
        local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_218.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_218.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_218.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_218.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_218.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
        local_218.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
        local_218.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
        local_218.m_backend.exp = (feastol->m_backend).exp;
        local_218.m_backend.neg = (feastol->m_backend).neg;
        local_218.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_218.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&result,local_178,&local_1c8,&local_218,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pSVar12);
        local_358.m_backend.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
        local_358.m_backend.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
        local_358.m_backend.data._M_elems._56_5_ = result.m_backend.data._M_elems._56_5_;
        local_358.m_backend.data._M_elems[0xf]._1_3_ = result.m_backend.data._M_elems[0xf]._1_3_;
        local_358.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
        local_358.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
        local_358.m_backend.data._M_elems[10] = result.m_backend.data._M_elems[10];
        local_358.m_backend.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
        local_358.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        local_358.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        local_358.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
        local_358.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
        local_358.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        local_358.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        local_358.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        local_358.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        local_358.m_backend.exp = result.m_backend.exp;
        local_358.m_backend.neg = result.m_backend.neg;
        local_358.m_backend.fpclass = result.m_backend.fpclass;
        local_358.m_backend.prec_elem = result.m_backend.prec_elem;
        tVar8 = boost::multiprecision::operator>
                          (&local_358,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_268);
        uVar11 = local_2f8;
        pSVar12 = local_300;
        if (tVar8) break;
      }
      else {
        (((local_300->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasibleCo).data[iVar2] = 0;
        uVar11 = local_2f8;
        pSVar12 = local_300;
      }
    }
    uVar10 = (ulong)((int)uVar10 - 1);
  } while( true );
  tVar8 = boost::multiprecision::operator>(&local_358,local_2f0);
  if (tVar8) {
    *(undefined8 *)((local_2f0->m_backend).data._M_elems + 0xc) =
         local_358.m_backend.data._M_elems._48_8_;
    *(ulong *)((local_2f0->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_358.m_backend.data._M_elems[0xf]._1_3_,
                  local_358.m_backend.data._M_elems._56_5_);
    *(undefined8 *)((local_2f0->m_backend).data._M_elems + 8) =
         local_358.m_backend.data._M_elems._32_8_;
    *(undefined8 *)((local_2f0->m_backend).data._M_elems + 10) =
         local_358.m_backend.data._M_elems._40_8_;
    *(undefined8 *)((local_2f0->m_backend).data._M_elems + 4) =
         local_358.m_backend.data._M_elems._16_8_;
    *(undefined8 *)((local_2f0->m_backend).data._M_elems + 6) =
         local_358.m_backend.data._M_elems._24_8_;
    *(undefined8 *)(local_2f0->m_backend).data._M_elems = local_358.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((local_2f0->m_backend).data._M_elems + 2) =
         local_358.m_backend.data._M_elems._8_8_;
    (local_2f0->m_backend).exp = local_358.m_backend.exp;
    (local_2f0->m_backend).neg = local_358.m_backend.neg;
    (local_2f0->m_backend).fpclass = local_358.m_backend.fpclass;
    (local_2f0->m_backend).prec_elem = local_358.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&(this->last).m_backend,&local_2e8[iVar2].m_backend);
    local_35c = local_2dc;
  }
  pSVar12 = local_300;
  (((local_300->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thesolver)->isInfeasibleCo).data[iVar2] = 2;
  DIdxSet::addIdx(this_00,iVar2);
  uVar11 = local_2f8;
  goto LAB_00366e90;
LAB_00366de9:
  result.m_backend.data._M_elems._0_8_ = result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
  tVar8 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_268,(int *)&result);
  if (tVar8) {
LAB_00366e0e:
    local_268.data._M_elems[0] = local_358.m_backend.data._M_elems[0];
    local_268.data._M_elems[1] = local_358.m_backend.data._M_elems[1];
    local_268.data._M_elems[2] = local_358.m_backend.data._M_elems[2];
    local_268.data._M_elems[3] = local_358.m_backend.data._M_elems[3];
    local_268.data._M_elems[4] = local_358.m_backend.data._M_elems[4];
    local_268.data._M_elems[5] = local_358.m_backend.data._M_elems[5];
    local_268.data._M_elems[6] = local_358.m_backend.data._M_elems[6];
    local_268.data._M_elems[7] = local_358.m_backend.data._M_elems[7];
    local_268.data._M_elems[8] = local_358.m_backend.data._M_elems[8];
    local_268.data._M_elems[9] = local_358.m_backend.data._M_elems[9];
    local_268.data._M_elems[10] = local_358.m_backend.data._M_elems[10];
    local_268.data._M_elems[0xb] = local_358.m_backend.data._M_elems[0xb];
    local_268.data._M_elems[0xc] = local_358.m_backend.data._M_elems[0xc];
    local_268.data._M_elems[0xd] = local_358.m_backend.data._M_elems[0xd];
    local_268.data._M_elems[0xf]._1_3_ = local_358.m_backend.data._M_elems[0xf]._1_3_;
    local_268.data._M_elems._56_5_ = local_358.m_backend.data._M_elems._56_5_;
    local_268.exp = local_358.m_backend.exp;
    local_268.neg = local_358.m_backend.neg;
    local_268.fpclass = local_358.m_backend.fpclass;
    local_268.prec_elem = local_358.m_backend.prec_elem;
  }
  goto LAB_00366aa6;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterHyperCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPricesCo.size() - 1; i >= 0; --i)
   {
      idx = bestPricesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPricesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   //scan the updated indeces for a better price
   for(int i = this->thesolver->updateViolsCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViolsCo.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasibleCo[idx] == this->VIOLATED)
      {
         x = test[idx];

         if(x < -feastol)
         {
            x = devexpr::computePrice(x, pen[idx], feastol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
                  last = pen[idx];
               }

               // put index into candidate list
               this->thesolver->isInfeasibleCo[idx] = this->VIOLATED_AND_CHECKED;
               bestPricesCo.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);
   else
      return SPxId();
}